

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O0

void P_SpawnSlopeMakers(FMapThing *firstmt,FMapThing *lastmt,int *oldvertextable)

{
  int tag;
  sector_t_conflict *this;
  FMapThing *pFVar1;
  double dVar2;
  TVector2<double> local_88;
  TVector2<double> local_78;
  TVector2<double> local_68;
  byte local_51;
  sector_t_conflict *psStack_50;
  bool ceiling;
  sector_t_conflict *sec;
  secplane_t *refplane;
  DVector3 pos;
  FMapThing *mt;
  int *oldvertextable_local;
  FMapThing *lastmt_local;
  FMapThing *firstmt_local;
  
  for (pos.Z = (double)firstmt; pFVar1 = firstmt, (ulong)pos.Z < lastmt;
      pos.Z = (double)((long)pos.Z + 0x90)) {
    if ((((*(long *)((long)pos.Z + 0x28) != 0) && (**(long **)((long)pos.Z + 0x28) == 0)) &&
        (0xe < *(short *)(*(long *)((long)pos.Z + 0x28) + 8))) &&
       (*(short *)(*(long *)((long)pos.Z + 0x28) + 8) < 0x15)) {
      TVector3<double>::TVector3
                ((TVector3<double> *)&refplane,(TVector3<double> *)((long)pos.Z + 8));
      TVector2<double>::TVector2(&local_68,(TVector3<double> *)((long)pos.Z + 8));
      psStack_50 = (sector_t_conflict *)P_PointInSector(&local_68);
      if (((*(short *)(*(long *)((long)pos.Z + 0x28) + 8) == 0x10) ||
          (*(short *)(*(long *)((long)pos.Z + 0x28) + 8) == 0x14)) ||
         (*(short *)(*(long *)((long)pos.Z + 0x28) + 8) == 0x12)) {
        sec = (sector_t_conflict *)&psStack_50->ceilingplane;
        local_51 = 1;
      }
      else {
        sec = (sector_t_conflict *)&psStack_50->floorplane;
        local_51 = 0;
      }
      this = sec;
      TVector2<double>::TVector2(&local_78,(TVector3<double> *)((long)pos.Z + 8));
      dVar2 = secplane_t::ZatPoint((secplane_t *)this,&local_78);
      pos.Y = dVar2 + *(double *)((long)pos.Z + 0x18);
      if (*(short *)(*(long *)((long)pos.Z + 0x28) + 8) < 0x11) {
        P_SlopeLineToPoint(*(int *)((long)pos.Z + 0x38),(DVector3 *)&refplane,(bool)(local_51 & 1));
      }
      else if (*(short *)(*(long *)((long)pos.Z + 0x28) + 8) < 0x13) {
        P_SetSlope((secplane_t *)sec,(bool)(local_51 & 1),(int)*(short *)((long)pos.Z + 0x20),
                   *(int *)((long)pos.Z + 0x38),(DVector3 *)&refplane);
      }
      else {
        P_VavoomSlope(psStack_50,*(int *)pos.Z,(DVector3 *)((long)pos.Z + 8),(uint)(local_51 & 1));
      }
      *(undefined2 *)((long)pos.Z + 0x26) = 0;
    }
  }
  while (pos.Z = (double)pFVar1, (ulong)pos.Z < lastmt) {
    if (((*(long *)((long)pos.Z + 0x28) != 0) && (**(long **)((long)pos.Z + 0x28) == 0)) &&
       ((*(short *)(*(long *)((long)pos.Z + 0x28) + 8) == 0x15 ||
        (*(short *)(*(long *)((long)pos.Z + 0x28) + 8) == 0x16)))) {
      tag = *(int *)((long)pos.Z + 0x38);
      TVector2<double>::TVector2(&local_88,(TVector3<double> *)((long)pos.Z + 8));
      P_CopyPlane(tag,&local_88,*(short *)(*(long *)((long)pos.Z + 0x28) + 8) == 0x16);
      *(undefined2 *)((long)pos.Z + 0x26) = 0;
    }
    pFVar1 = (FMapThing *)((long)pos.Z + 0x90);
  }
  P_SetSlopesFromVertexHeights(firstmt,lastmt,oldvertextable);
  return;
}

Assistant:

void P_SpawnSlopeMakers (FMapThing *firstmt, FMapThing *lastmt, const int *oldvertextable)
{
	FMapThing *mt;

	for (mt = firstmt; mt < lastmt; ++mt)
	{
		if (mt->info != NULL && mt->info->Type == NULL &&
		   (mt->info->Special >= SMT_SlopeFloorPointLine && mt->info->Special <= SMT_VavoomCeiling))
		{
			DVector3 pos = mt->pos;
			secplane_t *refplane;
			sector_t *sec;
			bool ceiling;

			sec = P_PointInSector (mt->pos);
			if (mt->info->Special == SMT_SlopeCeilingPointLine || mt->info->Special == SMT_VavoomCeiling || mt->info->Special == SMT_SetCeilingSlope)
			{
				refplane = &sec->ceilingplane;
				ceiling = true;
			}
			else
			{
				refplane = &sec->floorplane;
				ceiling = false;
			}
			pos.Z = refplane->ZatPoint (mt->pos) + mt->pos.Z;

			if (mt->info->Special <= SMT_SlopeCeilingPointLine)
			{ // SlopeFloorPointLine and SlopCeilingPointLine
				P_SlopeLineToPoint (mt->args[0], pos, ceiling);
			}
			else if (mt->info->Special <= SMT_SetCeilingSlope)
			{ // SetFloorSlope and SetCeilingSlope
				P_SetSlope (refplane, ceiling, mt->angle, mt->args[0], pos);
			}
			else 
			{ // VavoomFloor and VavoomCeiling (these do not perform any sector height adjustment - z is absolute)
				P_VavoomSlope(sec, mt->thingid, mt->pos, ceiling); 
			}
			mt->EdNum = 0;
		}
	}

	for (mt = firstmt; mt < lastmt; ++mt)
	{
		if (mt->info != NULL && mt->info->Type == NULL &&
			(mt->info->Special == SMT_CopyFloorPlane || mt->info->Special == SMT_CopyCeilingPlane))
		{
			P_CopyPlane (mt->args[0], mt->pos, mt->info->Special == SMT_CopyCeilingPlane);
			mt->EdNum = 0;
		}
	}

	P_SetSlopesFromVertexHeights(firstmt, lastmt, oldvertextable);
}